

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

Int __thiscall ipx::Basis::Load(Basis *this,int *basic_status)

{
  int iVar1;
  Int IVar2;
  int iVar3;
  size_type __n;
  int local_74;
  vector<int,_std::allocator<int>_> map2basis;
  vector<int,_std::allocator<int>_> basis;
  
  iVar1 = this->model_->num_rows_;
  basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __n = (long)this->model_->num_cols_ + (long)iVar1;
  std::vector<int,_std::allocator<int>_>::vector(&map2basis,__n,(allocator_type *)&local_74);
  iVar3 = 0;
  for (local_74 = 0; local_74 < (int)__n; local_74 = local_74 + 1) {
    switch(basic_status[local_74]) {
    case 0:
      std::vector<int,_std::allocator<int>_>::push_back(&basis,&local_74);
      map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_74] = iVar3;
      iVar3 = iVar3 + 1;
      break;
    case 1:
      std::vector<int,_std::allocator<int>_>::push_back(&basis,&local_74);
      map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_74] = iVar3 + iVar1;
      iVar3 = iVar3 + 1;
      break;
    case -2:
      map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_74] = -2;
      break;
    case -1:
      map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_74] = -1;
      break;
    default:
      goto switchD_0037191c_default;
    }
  }
  if (iVar3 == iVar1) {
    if ((long)basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      memmove((this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start,(long)basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    }
    if ((long)map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memmove((this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)map2basis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
    }
    IVar2 = Factorize(this);
  }
  else {
switchD_0037191c_default:
    IVar2 = 0x6b;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&map2basis.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&basis.super__Vector_base<int,_std::allocator<int>_>);
  return IVar2;
}

Assistant:

Int Basis::Load(const int* basic_status) {
    const Int m = model_.rows();
    const Int n = model_.cols();

    // Change member variables only when basis is valid.
    std::vector<Int> basis, map2basis(n+m);
    Int p = 0;
    for (Int j = 0; j < n+m; j++) {
        switch (basic_status[j]) {
        case NONBASIC_FIXED:
            map2basis[j] = -2;
            break;
        case NONBASIC:
            map2basis[j] = -1;
            break;
        case BASIC:
            basis.push_back(j);
            map2basis[j] = p++;
            break;
        case BASIC_FREE:
            basis.push_back(j);
            map2basis[j] = p++ + m;
            break;
        default:
            return IPX_ERROR_invalid_basis;
        }
    }
    if (p != m)
        return IPX_ERROR_invalid_basis;

    std::copy(basis.begin(), basis.end(), basis_.begin());
    std::copy(map2basis.begin(), map2basis.end(), map2basis_.begin());
    return Factorize();
}